

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

void Amap_ManMap(Amap_Man_t *p)

{
  Amap_Par_t *pAVar1;
  int iVar2;
  
  Amap_ManMerge(p);
  for (iVar2 = 0; pAVar1 = p->pPars, iVar2 < pAVar1->nIterFlow; iVar2 = iVar2 + 1) {
    Amap_ManMatch(p,1,(uint)(iVar2 != 0));
  }
  for (iVar2 = 0; iVar2 < pAVar1->nIterArea; iVar2 = iVar2 + 1) {
    Amap_ManMatch(p,0,(uint)(iVar2 != 0 || 0 < pAVar1->nIterFlow));
    pAVar1 = p->pPars;
  }
  Amap_ManCleanData(p);
  return;
}

Assistant:

void Amap_ManMap( Amap_Man_t * p )
{
    int i;
    Amap_ManMerge( p );
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, i>0 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, p->pPars->nIterFlow>0||i>0 );
/*
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, 1 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, 1 );
*/
    Amap_ManCleanData( p );
}